

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int ImParseFormatPrecision(char *fmt,int default_precision)

{
  bool bVar1;
  char *pcVar2;
  int in_ESI;
  char *in_RDI;
  int precision;
  int local_20;
  int local_18;
  int local_14;
  char *local_10;
  int local_4;
  
  local_14 = in_ESI;
  local_10 = ImParseFormatFindStart(in_RDI);
  if (*local_10 == '%') {
    do {
      pcVar2 = local_10;
      local_10 = pcVar2 + 1;
      bVar1 = false;
      if ('/' < *local_10) {
        bVar1 = *local_10 < ':';
      }
    } while (bVar1);
    local_18 = 0x7fffffff;
    if ((*local_10 == '.') &&
       ((local_10 = ImAtoi<int>(pcVar2 + 2,&local_18), local_18 < 0 || (99 < local_18)))) {
      local_18 = local_14;
    }
    if ((*local_10 == 'e') || (*local_10 == 'E')) {
      local_18 = -1;
    }
    if (((*local_10 == 'g') || (*local_10 == 'G')) && (local_18 == 0x7fffffff)) {
      local_18 = -1;
    }
    if (local_18 == 0x7fffffff) {
      local_20 = local_14;
    }
    else {
      local_20 = local_18;
    }
    local_4 = local_20;
  }
  else {
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

int ImParseFormatPrecision(const char* fmt, int default_precision)
{
    fmt = ImParseFormatFindStart(fmt);
    if (fmt[0] != '%')
        return default_precision;
    fmt++;
    while (*fmt >= '0' && *fmt <= '9')
        fmt++;
    int precision = INT_MAX;
    if (*fmt == '.')
    {
        fmt = ImAtoi<int>(fmt + 1, &precision);
        if (precision < 0 || precision > 99)
            precision = default_precision;
    }
    if (*fmt == 'e' || *fmt == 'E') // Maximum precision with scientific notation
        precision = -1;
    if ((*fmt == 'g' || *fmt == 'G') && precision == INT_MAX)
        precision = -1;
    return (precision == INT_MAX) ? default_precision : precision;
}